

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portable-file-dialogs.h
# Opt level: O0

void __thiscall
pfd::internal::executor::start_process
          (executor *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *command)

{
  char *__file;
  int iVar1;
  __pid_t _Var2;
  uint uVar3;
  reference ppcVar4;
  char **__argv;
  value_type pcStack_80;
  int flags;
  vector<char_*,_std::allocator<char_*>_> *local_78;
  vector<char_*,_std::allocator<char_*>_> *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  undefined1 local_48 [8];
  vector<char_*,_std::allocator<char_*>_> args;
  int local_28;
  int fd;
  int out [2];
  int in [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *command_local;
  executor *this_local;
  
  stop(this);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
            (&this->m_stdout);
  this->m_exit_code = -1;
  iVar1 = pipe(out);
  if ((iVar1 == 0) && (iVar1 = pipe(&local_28), iVar1 == 0)) {
    _Var2 = fork();
    this->m_pid = _Var2;
    if (-1 < this->m_pid) {
      close(out[(int)(uint)(this->m_pid == 0)]);
      close((&local_28)[(int)(uint)(this->m_pid != 0)]);
      if (this->m_pid == 0) {
        dup2(out[0],0);
        dup2(fd,1);
        args.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ = open("/dev/null",1);
        dup2(args.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_,2);
        close(args.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_);
        std::vector<char_*,_std::allocator<char_*>_>::vector
                  ((vector<char_*,_std::allocator<char_*>_> *)local_48);
        local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::cbegin(command);
        local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::cend(command);
        local_60 = (vector<char_*,_std::allocator<char_*>_> *)
                   std::back_inserter<std::vector<char*,std::allocator<char*>>>
                             ((vector<char_*,_std::allocator<char_*>_> *)local_48);
        local_78 = (vector<char_*,_std::allocator<char_*>_> *)
                   std::
                   transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<char*,std::allocator<char*>>>,pfd::internal::executor::start_process(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::_lambda(std::__cxx11::string_const&)_1_>
                             (local_50,local_58,local_60);
        pcStack_80 = (value_type)0x0;
        std::vector<char_*,_std::allocator<char_*>_>::push_back
                  ((vector<char_*,_std::allocator<char_*>_> *)local_48,&stack0xffffffffffffff80);
        ppcVar4 = std::vector<char_*,_std::allocator<char_*>_>::operator[]
                            ((vector<char_*,_std::allocator<char_*>_> *)local_48,0);
        __file = *ppcVar4;
        __argv = std::vector<char_*,_std::allocator<char_*>_>::data
                           ((vector<char_*,_std::allocator<char_*>_> *)local_48);
        execvp(__file,__argv);
        exit(1);
      }
      close(out[1]);
      this->m_fd = local_28;
      uVar3 = fcntl(this->m_fd,3);
      fcntl(this->m_fd,4,(ulong)(uVar3 | 0x800));
      this->m_running = true;
    }
  }
  return;
}

Assistant:

inline void internal::executor::start_process(std::vector<std::string> const &command)
{
    stop();
    m_stdout.clear();
    m_exit_code = -1;

    int in[2], out[2];
    if (pipe(in) != 0 || pipe(out) != 0)
        return;

    m_pid = fork();
    if (m_pid < 0)
        return;

    close(in[m_pid ? 0 : 1]);
    close(out[m_pid ? 1 : 0]);

    if (m_pid == 0)
    {
        dup2(in[0], STDIN_FILENO);
        dup2(out[1], STDOUT_FILENO);

        // Ignore stderr so that it doesn’t pollute the console (e.g. GTK+ errors from zenity)
        int fd = open("/dev/null", O_WRONLY);
        dup2(fd, STDERR_FILENO);
        close(fd);

        std::vector<char *> args;
        std::transform(command.cbegin(), command.cend(), std::back_inserter(args),
                       [](std::string const &s) { return const_cast<char *>(s.c_str()); });
        args.push_back(nullptr); // null-terminate argv[]

        execvp(args[0], args.data());
        exit(1);
    }

    close(in[1]);
    m_fd = out[0];
    auto flags = fcntl(m_fd, F_GETFL);
    fcntl(m_fd, F_SETFL, flags | O_NONBLOCK);

    m_running = true;
}